

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void __thiscall rsg::TexLookup::tokenize(TexLookup *this,GeneratorState *state,TokenStream *str)

{
  Type TVar1;
  char *pcVar2;
  Token local_30;
  
  TVar1 = state->m_shader->m_type;
  if (state->m_programParams->version == VERSION_300) {
    switch(this->m_type) {
    case TYPE_TEXTURE2D:
      Token::Token(&local_30,"texture");
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
      break;
    case TYPE_TEXTURE2D_LOD:
      pcVar2 = "texture";
      if (TVar1 == TYPE_VERTEX) {
        pcVar2 = "textureLod";
      }
      Token::Token(&local_30,pcVar2);
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
      break;
    case TYPE_TEXTURE2D_PROJ:
      Token::Token(&local_30,"textureProj");
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
      break;
    case TYPE_TEXTURE2D_PROJ_LOD:
      pcVar2 = "textureProj";
      if (TVar1 == TYPE_VERTEX) {
        pcVar2 = "textureProjLod";
      }
      Token::Token(&local_30,pcVar2);
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
      break;
    case TYPE_TEXTURECUBE:
      Token::Token(&local_30,"texture");
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
      break;
    case TYPE_TEXTURECUBE_LOD:
      pcVar2 = "texture";
      if (TVar1 == TYPE_VERTEX) {
        pcVar2 = "textureLod";
      }
      Token::Token(&local_30,pcVar2);
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
      break;
    default:
      goto switchD_019b5ccb_default;
    }
  }
  else {
    switch(this->m_type) {
    case TYPE_TEXTURE2D:
      Token::Token(&local_30,"texture2D");
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
      break;
    case TYPE_TEXTURE2D_LOD:
      pcVar2 = "texture2D";
      if (TVar1 == TYPE_VERTEX) {
        pcVar2 = "texture2DLod";
      }
      Token::Token(&local_30,pcVar2);
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
      break;
    case TYPE_TEXTURE2D_PROJ:
      Token::Token(&local_30,"texture2DProj");
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
      break;
    case TYPE_TEXTURE2D_PROJ_LOD:
      pcVar2 = "texture2DProj";
      if (TVar1 == TYPE_VERTEX) {
        pcVar2 = "texture2DProjLod";
      }
      Token::Token(&local_30,pcVar2);
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
      break;
    case TYPE_TEXTURECUBE:
      Token::Token(&local_30,"textureCube");
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
      break;
    case TYPE_TEXTURECUBE_LOD:
      pcVar2 = "textureCube";
      if (TVar1 == TYPE_VERTEX) {
        pcVar2 = "textureCubeLod";
      }
      Token::Token(&local_30,pcVar2);
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
      break;
    default:
      goto switchD_019b5ccb_default;
    }
  }
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_30);
switchD_019b5ccb_default:
  local_30.m_type = LEFT_PAREN;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
              (&str->m_tokens,str->m_numTokens + 0x40);
  }
  Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_30);
  Token::Token(&local_30,(this->m_sampler->m_name)._M_dataplus._M_p);
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
              (&str->m_tokens,str->m_numTokens + 0x40);
  }
  Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_30);
  local_30.m_type = COMMA;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
              (&str->m_tokens,str->m_numTokens + 0x40);
  }
  Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_30);
  (*this->m_coordExpr->_vptr_Expression[3])(this->m_coordExpr,state,str);
  if (this->m_lodBiasExpr != (Expression *)0x0) {
    local_30.m_type = COMMA;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                (&str->m_tokens,str->m_numTokens + 0x40);
    }
    Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
    str->m_numTokens = str->m_numTokens + 1;
    Token::~Token(&local_30);
    (*this->m_lodBiasExpr->_vptr_Expression[3])(this->m_lodBiasExpr,state,str);
  }
  local_30.m_type = RIGHT_PAREN;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
              (&str->m_tokens,str->m_numTokens + 0x40);
  }
  Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_30);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_30);
  return;
}

Assistant:

void TexLookup::tokenize (GeneratorState& state, TokenStream& str) const
{
	bool isVertex = state.getShader().getType() == Shader::TYPE_VERTEX;

	if (state.getProgramParameters().version == VERSION_300)
	{
		switch (m_type)
		{
			case TYPE_TEXTURE2D:			str << "texture";										break;
			case TYPE_TEXTURE2D_LOD:		str << (isVertex ? "textureLod" : "texture");			break;
			case TYPE_TEXTURE2D_PROJ:		str << "textureProj";									break;
			case TYPE_TEXTURE2D_PROJ_LOD:	str << (isVertex ? "textureProjLod" : "textureProj");	break;
			case TYPE_TEXTURECUBE:			str << "texture";										break;
			case TYPE_TEXTURECUBE_LOD:		str << (isVertex ? "textureLod" : "texture");			break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}
	else
	{
		switch (m_type)
		{
			case TYPE_TEXTURE2D:			str << "texture2D";											break;
			case TYPE_TEXTURE2D_LOD:		str << (isVertex ? "texture2DLod" : "texture2D");			break;
			case TYPE_TEXTURE2D_PROJ:		str << "texture2DProj";										break;
			case TYPE_TEXTURE2D_PROJ_LOD:	str << (isVertex ? "texture2DProjLod" : "texture2DProj");	break;
			case TYPE_TEXTURECUBE:			str << "textureCube";										break;
			case TYPE_TEXTURECUBE_LOD:		str << (isVertex ? "textureCubeLod" : "textureCube");		break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}

	str << Token::LEFT_PAREN;
	str << m_sampler->getName();
	str << Token::COMMA;
	m_coordExpr->tokenize(state, str);

	if (m_lodBiasExpr)
	{
		str << Token::COMMA;
		m_lodBiasExpr->tokenize(state, str);
	}

	str << Token::RIGHT_PAREN;
}